

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields.c
# Opt level: O3

void upb_FieldPathVector_Reserve(upb_FindContext *ctx,upb_FieldPathVector *vec,size_t elems)

{
  ulong uVar1;
  ulong uVar2;
  upb_FieldPathEntry *puVar3;
  ulong uVar4;
  
  uVar1 = vec->cap;
  if (uVar1 - vec->size < elems) {
    uVar2 = 4;
    if (4 < uVar1) {
      uVar2 = uVar1;
    }
    do {
      uVar4 = uVar2;
      uVar2 = uVar4 * 2;
    } while (uVar4 < vec->size + elems);
    vec->cap = uVar4;
    puVar3 = (upb_FieldPathEntry *)
             (*upb_alloc_global.func)
                       (&upb_alloc_global,vec->path,(long)((int)uVar1 << 4),(long)((int)uVar4 << 4))
    ;
    vec->path = puVar3;
    if (puVar3 == (upb_FieldPathEntry *)0x0) {
      siglongjmp((__jmp_buf_tag *)ctx->err,1);
    }
  }
  return;
}

Assistant:

static void upb_FieldPathVector_Reserve(upb_FindContext* ctx,
                                        upb_FieldPathVector* vec,
                                        size_t elems) {
  if (vec->cap - vec->size < elems) {
    const int oldsize = vec->cap * sizeof(*vec->path);
    size_t need = vec->size + elems;
    vec->cap = UPB_MAX(4, vec->cap);
    while (vec->cap < need) vec->cap *= 2;
    const int newsize = vec->cap * sizeof(*vec->path);
    vec->path = upb_grealloc(vec->path, oldsize, newsize);
    if (!vec->path) {
      UPB_LONGJMP(ctx->err, 1);
    }
  }
}